

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
::try_emplace_impl<char_const&>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
          *this,char *k)

{
  tuple<> local_21;
  tuple<const_char_&> local_20;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
  ::find_or_prepare_insert<char>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::pair<int,_int>_>_>_>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.super__Tuple_impl<0UL,_const_char_&>.super__Head_base<0UL,_const_char_&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_const_char_&>)(_Tuple_impl<0UL,_const_char_&>)k;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }